

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_common.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::Add
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this,
          FieldDescriptor *field,
          unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
          *field_generator)

{
  Descriptor **v1;
  Descriptor **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  pointer local_50;
  LogMessage local_48;
  Voidify local_31;
  Descriptor *local_30;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  *field_generator_local;
  FieldDescriptor *field_local;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)field_generator;
  field_generator_local =
       (unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
        *)field;
  field_local = (FieldDescriptor *)this;
  local_30 = FieldDescriptor::containing_type(field);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Descriptor_const*>
                 (&local_30);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Descriptor_const*>
                 (&this->descriptor_);
  local_28 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                       (v1,v2,"field->containing_type() == descriptor_");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/generator_common.h"
               ,0x33,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  local_50 = std::
             unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
             ::release(field_generator);
  std::
  vector<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
  ::push_back(&this->field_generators_,&local_50);
  return;
}

Assistant:

void Add(const FieldDescriptor* field,
           std::unique_ptr<FieldGeneratorType> field_generator) {
    ABSL_CHECK_EQ(field->containing_type(), descriptor_);
    field_generators_.push_back(field_generator.release());
  }